

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

VariableLookupPtr __thiscall
Lodtalk::EvaluationScope::lookSymbolRecursively(EvaluationScope *this,Oop symbol)

{
  bool bVar1;
  Oop symbol_00;
  undefined8 in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  VariableLookupPtr VVar2;
  undefined1 local_30 [8];
  VariableLookupPtr result;
  EvaluationScope *this_local;
  Oop symbol_local;
  
  result.super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)symbol.field_0;
  (**(code **)(*(long *)symbol.field_0 + 0x10))(local_30,symbol.field_0,in_RDX);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (!bVar1) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)((long)symbol.field_0 + 8));
    if (bVar1) {
      symbol_00.field_0 =
           (anon_union_8_4_0eb573b0_for_Oop_0)
           std::
           __shared_ptr_access<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)((long)symbol.field_0 + 8));
      lookSymbolRecursively(this,symbol_00);
      goto LAB_001a2c88;
    }
  }
  std::shared_ptr<Lodtalk::VariableLookup>::shared_ptr
            ((shared_ptr<Lodtalk::VariableLookup> *)this,
             (shared_ptr<Lodtalk::VariableLookup> *)local_30);
LAB_001a2c88:
  std::shared_ptr<Lodtalk::VariableLookup>::~shared_ptr
            ((shared_ptr<Lodtalk::VariableLookup> *)local_30);
  VVar2.super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  VVar2.super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (VariableLookupPtr)
         VVar2.super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

VariableLookupPtr EvaluationScope::lookSymbolRecursively(Oop symbol)
{
	auto result = lookSymbol(symbol);
	if(result || !parentScope)
		return result;
	return parentScope->lookSymbolRecursively(symbol);
}